

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::findreplace(CBString *this,char *sfind,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  allocator local_b1;
  CBStringException bstr__cppwrapper_exception;
  string local_88;
  string local_68;
  tagbstring u;
  tagbstring t;
  
  if ((sfind != (char *)0x0) && (repl != (char *)0x0)) {
    t.data = (uchar *)sfind;
    sVar2 = strlen(sfind);
    t.slen = (int)sVar2;
    t.mlen = -1;
    u.data = (uchar *)repl;
    sVar2 = strlen(repl);
    u.slen = (int)sVar2;
    u.mlen = -1;
    iVar1 = bfindreplace(&this->super_tagbstring,&t,&u,pos);
    if (iVar1 != -1) {
      return;
    }
    std::__cxx11::string::string((string *)&local_88,"CBString::Failure in findreplace",&local_b1);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  std::__cxx11::string::string((string *)&local_68,"CBString::findreplace NULL.",&local_b1);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::findreplace (const char * sfind, const char * repl, int pos) {
struct tagbstring t, u;
	if (NULL == repl || NULL == sfind) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("findreplace NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, sfind);
	cstr2tbstr (u, repl);
	if (BSTR_ERR == bfindreplace (this, (bstring) &t, (bstring) &u, pos)) {
		bstringThrow ("Failure in findreplace");
	}
}